

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O1

void Rml::Parse::Term(DataParser *parser)

{
  char cVar1;
  bool bVar2;
  Variant local_40;
  
  Factor(parser);
  bVar2 = true;
  do {
    if (parser->reached_end == false) {
      cVar1 = (parser->expression)._M_dataplus._M_p[parser->index];
    }
    else {
      cVar1 = '\0';
    }
    if (cVar1 == '/') {
      DataParser::Match(parser,'/',true);
      DataParser::Push(parser);
      Factor(parser);
      DataParser::Pop(parser,L);
      Variant::Variant(&local_40);
      DataParser::Emit(parser,Divide,&local_40);
LAB_001f3bef:
      Variant::~Variant(&local_40);
    }
    else {
      if (cVar1 == '*') {
        DataParser::Match(parser,'*',true);
        DataParser::Push(parser);
        Factor(parser);
        DataParser::Pop(parser,L);
        Variant::Variant(&local_40);
        DataParser::Emit(parser,Multiply,&local_40);
        goto LAB_001f3bef;
      }
      bVar2 = false;
    }
    if (!bVar2) {
      return;
    }
  } while( true );
}

Assistant:

static void Term(DataParser& parser)
	{
		Factor(parser);

		bool looping = true;
		while (looping)
		{
			switch (parser.Look())
			{
			case '*': Multiply(parser); break;
			case '/': Divide(parser); break;
			default: looping = false;
			}
		}
	}